

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

int64_t sysbvm_tuple_integer_decodeInt64(sysbvm_context_t *context,sysbvm_tuple_t value)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_context_t *local_38;
  int64_t decodedValue;
  sysbvm_integer_t *integer;
  size_t byteSize;
  sysbvm_tuple_t value_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isImmediate(value);
  if (_Var1) {
    context_local = (sysbvm_context_t *)sysbvm_tuple_integer_decodeSmall(value);
  }
  else {
    sVar2 = sysbvm_tuple_getSizeInBytes(value);
    if (sVar2 < 4) {
      context_local = (sysbvm_context_t *)0x0;
    }
    else {
      if (sVar2 < 8) {
        local_38 = (sysbvm_context_t *)(ulong)*(uint *)(value + 0x10);
      }
      else {
        local_38 = *(sysbvm_context_t **)(value + 0x10);
      }
      sVar3 = sysbvm_tuple_getType(context,value);
      if (sVar3 == (context->roots).largeNegativeIntegerType) {
        local_38 = (sysbvm_context_t *)-(long)local_38;
      }
      context_local = local_38;
    }
  }
  return (int64_t)context_local;
}

Assistant:

int64_t sysbvm_tuple_integer_decodeInt64(sysbvm_context_t *context, sysbvm_tuple_t value)
{
    if(sysbvm_tuple_isImmediate(value))
        return sysbvm_tuple_integer_decodeSmall(value);

    size_t byteSize = sysbvm_tuple_getSizeInBytes(value);
    if(byteSize < 4)
        return 0;

    sysbvm_integer_t *integer = (sysbvm_integer_t *)value;
    int64_t decodedValue = 0;
    if(byteSize >= 8)
        decodedValue = (uint64_t)integer->words[0] | ((uint64_t)integer->words[1] << 32);
    else
        decodedValue = (uint64_t)integer->words[0];
    
    if(sysbvm_tuple_getType(context, value) == context->roots.largeNegativeIntegerType)
        decodedValue = -decodedValue;
    return decodedValue;
}